

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_doc *
duckdb_yyjson::read_root_single
          (u8 *hdr,u8 *cur,u8 *end,yyjson_alc alc,yyjson_read_flag flg,yyjson_read_err *err)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  bool bVar20;
  yyjson_read_code yVar21;
  uint uVar22;
  yyjson_doc *pyVar23;
  ulong uVar24;
  ulong uVar25;
  u8 *puVar26;
  byte bVar27;
  byte bVar28;
  sbyte sVar29;
  code cVar30;
  long lVar31;
  long lVar32;
  char *pcVar33;
  int iVar34;
  uint uVar35;
  undefined2 uVar36;
  u32 uVar37;
  uint uVar38;
  u8 **pre;
  int iVar39;
  _func_void_ptr_void_ptr_size_t *p_Var40;
  _func_void_ptr_void_ptr_size_t *p_Var41;
  ulong uVar42;
  ulong uVar43;
  u64 *__s;
  yyjson_val *pyVar44;
  long lVar45;
  yyjson_doc *val;
  _func_void_ptr_void_ptr_size_t *p_Var46;
  char cVar47;
  ulong uVar48;
  _func_void_ptr_void_ptr_size_t *p_Var49;
  _func_void_ptr_void_ptr_size_t *p_Var50;
  _func_void_ptr_void_ptr_size_t *p_Var51;
  _func_void_ptr_void_ptr_size_t *p_Var52;
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  i32 exp;
  u8 *raw_end;
  bigint big_full;
  _func_void_ptr_void_ptr_size_t *local_4b0;
  u8 **local_4a8;
  char *local_4a0;
  yyjson_doc *local_498;
  yyjson_read_flag local_48c;
  _func_void_ptr_void_ptr_size_t *local_488;
  char *local_480;
  u8 *local_478;
  ulong local_470;
  yyjson_read_err *local_468;
  uint local_45c;
  bigint *local_458;
  _func_void_ptr_void_ptr_size_t *local_450;
  u8 *local_448;
  bigint local_440;
  bigint local_238;
  
  local_4b0 = (_func_void_ptr_void_ptr_size_t *)cur;
  pyVar23 = (yyjson_doc *)(*alc.malloc)(alc.ctx,0x50);
  if (pyVar23 == (yyjson_doc *)0x0) {
    bVar20 = is_truncated_end(hdr,cur,end,2,flg);
    if (bVar20) {
      err->pos = (long)end - (long)hdr;
      err->code = 5;
      pcVar33 = "unexpected end of data";
    }
    else {
      err->pos = (long)cur - (long)hdr;
      err->code = 2;
      pcVar33 = "memory allocation failed";
    }
    err->msg = pcVar33;
    return (yyjson_doc *)0x0;
  }
  val = pyVar23 + 1;
  pre = (u8 **)0x0;
  if ((flg & 0xa0) != 0) {
    pre = &local_448;
  }
  local_448 = (u8 *)0x0;
  bVar28 = *cur;
  pcVar33 = (char *)(ulong)bVar28;
  cVar47 = (char)flg;
  local_468 = err;
  if ((pcVar33[0x1f59fd0] & 2U) == 0) {
    if (0x6d < bVar28) {
      if (bVar28 == 0x6e) {
        uVar35 = *(uint *)cur;
        if (uVar35 == 0x6c6c756e) {
          val->root = (yyjson_val *)0x2;
LAB_01d0faad:
          local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 4);
          goto LAB_01d10090;
        }
        if (((((flg & 0x10) != 0) && ((uVar35 & 0xff | 0x20) == 0x6e)) &&
            ((uVar35 >> 8 & 0xff | 0x20) == 0x61)) && ((uVar35 >> 0x10 & 0xff | 0x20) == 0x6e)) {
          local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 3);
          if ((flg & 0xa0) == 0) {
            pyVar23[1].root = (yyjson_val *)0x14;
            pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
          }
          else {
            if (*pre != (u8 *)0x0) {
              **pre = '\0';
            }
            *pre = (u8 *)local_4b0;
            pyVar23[1].root = (yyjson_val *)0x301;
            pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
          }
          goto LAB_01d10090;
        }
      }
      else {
        if (bVar28 != 0x74) goto LAB_01d0f72f;
        if (*(int *)cur == 0x65757274) {
          val->root = (yyjson_val *)0xb;
          goto LAB_01d0faad;
        }
      }
LAB_01d107d1:
      bVar20 = is_truncated_end(hdr,cur,end,0xb,flg);
      if (bVar20) {
        cur = end;
      }
      yVar21 = 5;
      if (!bVar20) {
        yVar21 = 0xb;
      }
      pcVar33 = "invalid literal";
      if (bVar20) {
        pcVar33 = "unexpected end of data";
      }
      local_468->pos = (long)cur - (long)hdr;
      local_468->code = yVar21;
      local_468->msg = pcVar33;
      goto LAB_01d0f79d;
    }
    if (bVar28 == 0x22) {
      p_Var40 = (_func_void_ptr_void_ptr_size_t *)(cur + 1);
      p_Var51 = p_Var40;
LAB_01d0f7b5:
      p_Var49 = p_Var51;
      uVar48 = (ulong)(byte)*p_Var49;
      if ((char_table[uVar48] & 0xc) == 0) {
        p_Var51 = p_Var49 + 8;
        do {
          p_Var49 = p_Var51;
          uVar48 = (ulong)(byte)p_Var49[-7];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -7;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[-6];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -6;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[-5];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -5;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[-4];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -4;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[-3];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -3;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[-2];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -2;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[-1];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + -1;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)*p_Var49;
          if ((char_table[uVar48] & 0xc) != 0) goto LAB_01d0f924;
          uVar48 = (ulong)(byte)p_Var49[1];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 1;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[2];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 2;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[3];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 3;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[4];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 4;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[5];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 5;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[6];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 6;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[7];
          if ((char_table[uVar48] & 0xc) != 0) {
            p_Var49 = p_Var49 + 7;
            goto LAB_01d0f924;
          }
          uVar48 = (ulong)(byte)p_Var49[8];
          p_Var51 = p_Var49 + 0x10;
        } while ((char_table[uVar48] & 0xc) == 0);
        p_Var49 = p_Var49 + 8;
      }
LAB_01d0f924:
      if ((char)uVar48 == '\"') {
        pyVar23[1].root = (yyjson_val *)(((long)p_Var49 - (long)p_Var40) * 0x100 | 0xd);
        pyVar23[1].alc.malloc = p_Var40;
        *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x0;
        local_4b0 = p_Var49 + 1;
        goto LAB_01d10090;
      }
      local_4a0 = "invalid UTF-8 encoding in string";
      p_Var51 = p_Var49;
      if ((char)uVar48 < '\0') goto code_r0x01d0f94e;
LAB_01d10f7a:
      if ((byte)uVar48 == 0x5c) {
        cVar30 = p_Var51[1];
        if ((byte)cVar30 < 0x62) {
          if (cVar30 == (code)0x22) {
            *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x22;
          }
          else if (cVar30 == (code)0x2f) {
            *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x2f;
          }
          else {
            if (cVar30 != (code)0x5c) goto switchD_01d10fba_caseD_6f;
            *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x5c;
          }
        }
        else {
          switch(cVar30) {
          case (code)0x6e:
            *p_Var49 = (_func_void_ptr_void_ptr_size_t)0xa;
            break;
          case (code)0x6f:
          case (code)0x70:
          case (code)0x71:
          case (code)0x73:
switchD_01d10fba_caseD_6f:
            p_Var51 = p_Var51 + 1;
            pcVar33 = "invalid escaped character in string";
            goto LAB_01d115ca;
          case (code)0x72:
            *p_Var49 = (_func_void_ptr_void_ptr_size_t)0xd;
            break;
          case (code)0x74:
            *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x9;
            break;
          case (code)0x75:
            uVar19 = CONCAT11(hex_conv_table[(byte)p_Var51[3]],hex_conv_table[(byte)p_Var51[5]]);
            if (((uVar19 | CONCAT11(hex_conv_table[(byte)p_Var51[2]],
                                    hex_conv_table[(byte)p_Var51[4]])) & 0xf0f0) == 0) {
              uVar22 = (uint)CONCAT11(hex_conv_table[(byte)p_Var51[2]],
                                      hex_conv_table[(byte)p_Var51[4]]) << 4;
              uVar35 = uVar19 | uVar22;
              p_Var52 = p_Var51 + 6;
              if ((uVar35 & 0xf800) != 0xd800) {
                uVar22 = (uint)uVar19 | uVar22 & 0xffff;
                bVar28 = (byte)uVar35;
                if (uVar22 < 0x800) {
                  if (uVar22 < 0x80) {
                    *p_Var49 = (_func_void_ptr_void_ptr_size_t)bVar28;
                    p_Var49 = p_Var49 + 1;
                  }
                  else {
                    *p_Var49 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar35 >> 6) | 0xc0);
                    p_Var49[1] = (_func_void_ptr_void_ptr_size_t)(bVar28 & 0x3f | 0x80);
                    p_Var49 = p_Var49 + 2;
                  }
                }
                else {
                  *p_Var49 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar22 >> 0xc) | 0xe0);
                  p_Var49[1] = (_func_void_ptr_void_ptr_size_t)((byte)(uVar35 >> 6) & 0x3f | 0x80);
                  p_Var49[2] = (_func_void_ptr_void_ptr_size_t)(bVar28 & 0x3f | 0x80);
                  p_Var49 = p_Var49 + 3;
                }
                goto LAB_01d110b0;
              }
              if ((uVar35 & 0xdc00) == 0xd800) {
                if (*(short *)p_Var52 == 0x755c) {
                  if (((CONCAT11(hex_conv_table[(byte)p_Var51[9]],hex_conv_table[(byte)p_Var51[0xb]]
                                ) |
                       CONCAT11(hex_conv_table[(byte)p_Var51[8]],hex_conv_table[(byte)p_Var51[10]]))
                      & 0xf0f0) == 0) {
                    uVar22 = (CONCAT11(hex_conv_table[(byte)p_Var51[8]],
                                       hex_conv_table[(byte)p_Var51[10]]) & 0xfff) << 4 |
                             (uint)CONCAT11(hex_conv_table[(byte)p_Var51[9]],
                                            hex_conv_table[(byte)p_Var51[0xb]]);
                    if ((uVar22 & 0xfc00) == 0xdc00) {
                      iVar34 = (uVar35 & 0xdbff) * 0x400;
                      uVar35 = iVar34 + uVar22 + 0xfca02400;
                      *p_Var49 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar35 >> 0x12) | 0xf0);
                      p_Var49[1] = (_func_void_ptr_void_ptr_size_t)
                                   ((byte)(uVar35 >> 0xc) & 0x3f | 0x80);
                      p_Var49[2] = (_func_void_ptr_void_ptr_size_t)
                                   ((byte)(uVar22 + iVar34 + 0x400 >> 6) & 0x3f | 0x80);
                      p_Var49[3] = (_func_void_ptr_void_ptr_size_t)((byte)uVar22 & 0x3f | 0x80);
                      p_Var49 = p_Var49 + 4;
                      p_Var52 = p_Var51 + 0xc;
                      goto LAB_01d110b0;
                    }
                    p_Var51 = p_Var52;
                    pcVar33 = "invalid low surrogate in string";
                  }
                  else {
                    p_Var51 = p_Var52;
                    pcVar33 = "invalid escaped sequence in string";
                  }
                }
                else {
                  p_Var51 = p_Var52;
                  pcVar33 = "no low surrogate in string";
                }
              }
              else {
                pcVar33 = "invalid high surrogate in string";
              }
            }
            else {
              pcVar33 = "invalid escaped sequence in string";
            }
            goto LAB_01d115ca;
          default:
            if (cVar30 == (code)0x62) {
              *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x8;
            }
            else {
              if (cVar30 != (code)0x66) goto switchD_01d10fba_caseD_6f;
              *p_Var49 = (_func_void_ptr_void_ptr_size_t)0xc;
            }
          }
        }
        p_Var49 = p_Var49 + 1;
        p_Var52 = p_Var51 + 2;
LAB_01d110b0:
        do {
          p_Var51 = p_Var52;
          if ((char_table[(byte)*p_Var51] & 0xc) == 0) {
            if ((char_table[(byte)p_Var51[1]] & 0xc) != 0) {
              uVar36 = *(undefined2 *)p_Var51;
              goto LAB_01d111ca;
            }
            if ((char_table[(byte)p_Var51[2]] & 0xc) == 0) {
              if ((char_table[(byte)p_Var51[3]] & 0xc) == 0) {
                if ((char_table[(byte)p_Var51[4]] & 0xc) == 0) {
                  if ((char_table[(byte)p_Var51[5]] & 0xc) == 0) {
                    if ((char_table[(byte)p_Var51[6]] & 0xc) == 0) {
                      if ((char_table[(byte)p_Var51[7]] & 0xc) == 0) {
                        if ((char_table[(byte)p_Var51[8]] & 0xc) == 0) {
                          if ((char_table[(byte)p_Var51[9]] & 0xc) == 0) {
                            if ((char_table[(byte)p_Var51[10]] & 0xc) == 0) {
                              if ((char_table[(byte)p_Var51[0xb]] & 0xc) == 0) {
                                if ((char_table[(byte)p_Var51[0xc]] & 0xc) == 0) {
                                  if ((char_table[(byte)p_Var51[0xd]] & 0xc) == 0) {
                                    if ((char_table[(byte)p_Var51[0xe]] & 0xc) == 0) {
                                      bVar28 = char_table[(byte)p_Var51[0xf]];
                                      uVar2 = *(undefined8 *)(p_Var51 + 8);
                                      *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                                      *(undefined8 *)(p_Var49 + 8) = uVar2;
                                      if ((bVar28 & 0xc) == 0) {
                                        p_Var49 = p_Var49 + 0x10;
                                        p_Var52 = p_Var51 + 0x10;
                                        goto LAB_01d110b0;
                                      }
                                      p_Var51 = p_Var51 + 0xf;
                                      p_Var49 = p_Var49 + 0xf;
                                    }
                                    else {
                                      *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                                      *(uint *)(p_Var49 + 8) = *(uint *)(p_Var51 + 8);
                                      *(undefined2 *)(p_Var49 + 0xc) =
                                           *(undefined2 *)(p_Var51 + 0xc);
                                      p_Var49 = p_Var49 + 0xe;
                                      p_Var51 = p_Var51 + 0xe;
                                    }
                                  }
                                  else {
                                    *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                                    *(uint *)(p_Var49 + 8) = *(uint *)(p_Var51 + 8);
                                    *(undefined2 *)(p_Var49 + 0xc) = *(undefined2 *)(p_Var51 + 0xc);
                                    p_Var49 = p_Var49 + 0xd;
                                    p_Var51 = p_Var51 + 0xd;
                                  }
                                }
                                else {
                                  *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                                  *(uint *)(p_Var49 + 8) = *(uint *)(p_Var51 + 8);
                                  p_Var49 = p_Var49 + 0xc;
                                  p_Var51 = p_Var51 + 0xc;
                                }
                              }
                              else {
                                *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                                *(uint *)(p_Var49 + 8) = *(uint *)(p_Var51 + 8);
                                p_Var49 = p_Var49 + 0xb;
                                p_Var51 = p_Var51 + 0xb;
                              }
                            }
                            else {
                              *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                              *(undefined2 *)(p_Var49 + 8) = *(undefined2 *)(p_Var51 + 8);
                              p_Var49 = p_Var49 + 10;
                              p_Var51 = p_Var51 + 10;
                            }
                          }
                          else {
                            *(undefined8 *)p_Var49 = *(undefined8 *)p_Var51;
                            *(undefined2 *)(p_Var49 + 8) = *(undefined2 *)(p_Var51 + 8);
                            p_Var49 = p_Var49 + 9;
                            p_Var51 = p_Var51 + 9;
                          }
                        }
                        else {
                          uVar2 = *(undefined8 *)p_Var51;
                          p_Var51 = p_Var51 + 8;
                          *(undefined8 *)p_Var49 = uVar2;
                          p_Var49 = p_Var49 + 8;
                        }
                      }
                      else {
                        uVar2 = *(undefined8 *)p_Var51;
                        p_Var51 = p_Var51 + 7;
                        *(undefined8 *)p_Var49 = uVar2;
                        p_Var49 = p_Var49 + 7;
                      }
                    }
                    else {
                      *(uint *)p_Var49 = *(uint *)p_Var51;
                      *(undefined2 *)(p_Var49 + 4) = *(undefined2 *)(p_Var51 + 4);
                      p_Var49 = p_Var49 + 6;
                      p_Var51 = p_Var51 + 6;
                    }
                  }
                  else {
                    *(uint *)p_Var49 = *(uint *)p_Var51;
                    *(undefined2 *)(p_Var49 + 4) = *(undefined2 *)(p_Var51 + 4);
                    p_Var49 = p_Var49 + 5;
                    p_Var51 = p_Var51 + 5;
                  }
                }
                else {
                  uVar35 = *(uint *)p_Var51;
                  p_Var51 = p_Var51 + 4;
                  *(uint *)p_Var49 = uVar35;
                  p_Var49 = p_Var49 + 4;
                }
              }
              else {
                uVar35 = *(uint *)p_Var51;
                p_Var51 = p_Var51 + 3;
                *(uint *)p_Var49 = uVar35;
                p_Var49 = p_Var49 + 3;
              }
            }
            else {
              uVar36 = *(undefined2 *)p_Var51;
              p_Var51 = p_Var51 + 2;
              *(undefined2 *)p_Var49 = uVar36;
              p_Var49 = p_Var49 + 2;
            }
          }
          while( true ) {
            uVar48 = (ulong)(byte)*p_Var51;
            if (-1 < (char)*p_Var51) goto LAB_01d10f7a;
            uVar35 = *(uint *)p_Var51;
            p_Var52 = p_Var51;
            while ((((uVar35 & 0xc0c0f0) == 0x8080e0 && ((uVar35 & 0x200f) != 0)) &&
                   ((uVar35 & 0x200f) != 0x200d))) {
              *(uint *)p_Var49 = uVar35;
              p_Var49 = p_Var49 + 3;
              pcVar1 = p_Var52 + 3;
              p_Var52 = p_Var52 + 3;
              uVar35 = *(uint *)pcVar1;
            }
            if (-1 < (char)uVar35) break;
            if ((uVar35 & 0x1e) != 0 && (uVar35 & 0xc0e0) == 0x80c0) {
              do {
                *(short *)p_Var49 = (short)uVar35;
                p_Var49 = p_Var49 + 2;
                uVar35 = *(uint *)(p_Var52 + 2);
                p_Var52 = p_Var52 + 2;
                if ((uVar35 & 0xc0e0) != 0x80c0) break;
              } while ((uVar35 & 0x1e) != 0);
            }
            if (((uVar35 & 0x3007) != 0 && (uVar35 & 0xc0c0c0f8) == 0x808080f0) &&
               (p_Var46 = p_Var49, ((byte)uVar35 >> 2 & (uVar35 & 0x3003) != 0) == 0)) {
              while( true ) {
                p_Var52 = p_Var52 + 4;
                p_Var49 = p_Var46 + 4;
                *(uint *)p_Var46 = uVar35;
                uVar35 = *(uint *)p_Var52;
                if ((uVar35 & 0x3007) == 0) break;
                if (((uVar35 & 0xc0c0c0f8) != 0x808080f0) ||
                   (p_Var46 = p_Var49, ((byte)uVar35 >> 2 & (uVar35 & 0x3003) != 0) != 0)) break;
              }
            }
            uVar36 = (undefined2)uVar35;
            if (p_Var51 != p_Var52) break;
            p_Var51 = p_Var52;
            pcVar33 = local_4a0;
            if ((flg & 0x40) == 0) goto LAB_01d115ca;
LAB_01d111ca:
            *(undefined2 *)p_Var49 = uVar36;
            p_Var51 = p_Var51 + 1;
            p_Var49 = p_Var49 + 1;
          }
        } while( true );
      }
      if ((int)uVar48 == 0x22) {
        pyVar23[1].root = (yyjson_val *)(((long)p_Var49 - (long)p_Var40) * 0x100 | 5);
        pyVar23[1].alc.malloc = p_Var40;
        *p_Var49 = (_func_void_ptr_void_ptr_size_t)0x0;
        local_4b0 = p_Var51 + 1;
        local_498 = val;
        local_48c = flg;
        goto LAB_01d10090;
      }
      if ((flg & 0x40) == 0) {
        pcVar33 = "unexpected control character in string";
      }
      else {
        pcVar33 = "unclosed string";
        if (p_Var51 < end) {
          *p_Var49 = (_func_void_ptr_void_ptr_size_t)(byte)uVar48;
          p_Var49 = p_Var49 + 1;
          p_Var52 = p_Var51 + 1;
          goto LAB_01d110b0;
        }
      }
LAB_01d115ca:
      local_4a0 = pcVar33;
      local_498 = val;
      local_48c = flg;
      bVar20 = is_truncated_end(hdr,(u8 *)p_Var51,end,10,flg);
      if (bVar20) {
        p_Var51 = (_func_void_ptr_void_ptr_size_t *)end;
      }
      pcVar33 = "unexpected end of data";
      if (!bVar20) {
        pcVar33 = local_4a0;
      }
      local_468->pos = (long)p_Var51 - (long)hdr;
      local_468->code = (uint)!bVar20 * 5 + 5;
      local_468->msg = pcVar33;
      goto LAB_01d0f79d;
    }
    if (bVar28 == 0x66) {
      if (*(int *)(cur + 1) != 0x65736c61) goto LAB_01d107d1;
      val->root = (yyjson_val *)0x3;
      local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 5);
      goto LAB_01d10090;
    }
LAB_01d0f72f:
    if ((flg & 0x10) != 0) {
      if (bVar28 == 0x69) {
LAB_01d10721:
        if (((cur[1] | 0x20) == 0x6e) && ((cur[2] | 0x20) == 0x66)) {
          local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 3);
          if (((cur[3] | 0x20) == 0x69) &&
             (((((cur[4] | 0x20) == 0x6e && ((cur[5] | 0x20) == 0x69)) && ((cur[6] | 0x20) == 0x74))
              && ((cur[7] | 0x20) == 0x79)))) {
            local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 8);
          }
          if ((flg & 0xa0) == 0) {
            pyVar23[1].root = (yyjson_val *)0x14;
            pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
          }
          else {
            if (*pre != (u8 *)0x0) {
              **pre = '\0';
            }
            *pre = (u8 *)local_4b0;
            pyVar23[1].root = (yyjson_val *)(((long)local_4b0 - (long)cur) * 0x100 + 1);
            pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
          }
          goto LAB_01d10090;
        }
        if (bVar28 != 0x4e) goto LAB_01d0f742;
      }
      else if (bVar28 != 0x4e) {
        if (bVar28 != 0x49) goto LAB_01d0f742;
        goto LAB_01d10721;
      }
      if (((cur[1] | 0x20) == 0x61) && ((cur[2] | 0x20) == 0x6e)) {
        local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 3);
        if ((flg & 0xa0) == 0) {
          pyVar23[1].root = (yyjson_val *)0x14;
          pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
        }
        else {
          if (*pre != (u8 *)0x0) {
            **pre = '\0';
          }
          *pre = (u8 *)local_4b0;
          pyVar23[1].root = (yyjson_val *)0x301;
          pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
        }
        goto LAB_01d10090;
      }
    }
LAB_01d0f742:
    bVar20 = is_truncated_end(hdr,cur,end,6,flg);
    if (bVar20) {
      cur = end;
    }
    pcVar33 = "unexpected character";
    if (bVar20) {
      pcVar33 = "unexpected end of data";
    }
    local_468->pos = (long)cur - (long)hdr;
    local_468->code = 6 - bVar20;
    local_468->msg = pcVar33;
LAB_01d0f79d:
    (*alc.free)(alc.ctx,pyVar23);
    return (yyjson_doc *)0x0;
  }
  local_45c = 0;
  if (cVar47 < '\0' || (flg & 0xa0) == 0) {
    uVar24 = (ulong)(bVar28 == 0x2d);
    p_Var51 = (_func_void_ptr_void_ptr_size_t *)(cur + uVar24);
    bVar27 = cur[uVar24];
    uVar48 = (ulong)bVar27;
    local_4a8 = pre;
    local_4a0 = pcVar33;
    local_488 = (_func_void_ptr_void_ptr_size_t *)cur;
    if ((digi_table[uVar48] & 2) == 0) {
      if (bVar27 != 0x30) {
        if ((flg & 0x10) != 0) {
          p_Var40 = p_Var51 + -(ulong)(bVar28 == 0x2d);
          if (bVar27 < 0x69) {
            if (bVar27 == 0x49) {
LAB_01d11f2f:
              if ((((byte)p_Var51[1] | 0x20) == 0x6e) && (((byte)p_Var51[2] | 0x20) == 0x66)) {
                local_4b0 = p_Var51 + 3;
                if ((((byte)p_Var51[3] | 0x20) == 0x69) &&
                   ((((((byte)p_Var51[4] | 0x20) == 0x6e && (((byte)p_Var51[5] | 0x20) == 0x69)) &&
                     (((byte)p_Var51[6] | 0x20) == 0x74)) && (((byte)p_Var51[7] | 0x20) == 0x79))))
                {
                  local_4b0 = p_Var51 + 8;
                }
                if ((flg & 0xa0) == 0) {
                  pyVar23[1].root = (yyjson_val *)0x14;
                  pyVar23[1].alc.malloc =
                       (_func_void_ptr_void_ptr_size_t *)
                       (((ulong)(bVar28 != 0x2d) << 0x3f) + -0x10000000000000);
                }
                else {
                  if (*pre != (u8 *)0x0) {
                    **pre = '\0';
                  }
                  *pre = (u8 *)local_4b0;
                  pyVar23[1].root = (yyjson_val *)(((long)local_4b0 - (long)p_Var40) * 0x100 + 1);
                  pyVar23[1].alc.malloc = p_Var40;
                }
                goto LAB_01d10090;
              }
              if ((bVar27 | 0x20) == 0x6e) goto LAB_01d11fe5;
            }
            else if (bVar27 == 0x4e) goto LAB_01d11fe5;
          }
          else if (bVar27 == 0x6e) {
LAB_01d11fe5:
            if ((((byte)p_Var51[1] | 0x20) == 0x61) && (((byte)p_Var51[2] | 0x20) == 0x6e)) {
              local_4b0 = p_Var51 + 3;
              if ((flg & 0xa0) == 0) {
                pyVar23[1].root = (yyjson_val *)0x14;
                pyVar23[1].alc.malloc =
                     (_func_void_ptr_void_ptr_size_t *)
                     (((ulong)(bVar28 != 0x2d) << 0x3f) + -0x8000000000000);
              }
              else {
                if (*pre != (u8 *)0x0) {
                  **pre = '\0';
                }
                *pre = (u8 *)local_4b0;
                pyVar23[1].root = (yyjson_val *)((ulong)(bVar28 == 0x2d) * 0x100 + 0x301);
                pyVar23[1].alc.malloc = p_Var40;
              }
              goto LAB_01d10090;
            }
          }
          else if (bVar27 == 0x69) goto LAB_01d11f2f;
        }
        local_480 = "no digit after minus sign";
        local_4b0 = p_Var51;
        goto LAB_01d1011c;
      }
      p_Var40 = p_Var51 + 1;
      bVar27 = digi_table[(byte)p_Var51[1]];
      if ((bVar27 & 0x33) == 0) {
        pyVar23[1].root = (yyjson_val *)((ulong)(bVar28 == 0x2d) * 8 + 4);
        pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        local_4b0 = p_Var40;
      }
      else {
        if (p_Var51[1] == (_func_void_ptr_void_ptr_size_t)0x2e) {
          if ((digi_table[(byte)p_Var51[2]] & 3) == 0) {
            p_Var51 = p_Var51 + 2;
            local_480 = "no digit after decimal point";
            local_4b0 = p_Var51;
            local_498 = val;
            goto LAB_01d1011c;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(cur + uVar24 + 1);
          do {
            p_Var49 = p_Var40;
            uVar48 = (ulong)(byte)p_Var49[1];
            p_Var40 = p_Var49 + 1;
          } while (uVar48 == 0x30);
          bVar27 = digi_table[uVar48];
          if ((bVar27 & 3) != 0) {
            p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 - 0x30);
            goto LAB_01d1181c;
          }
        }
        if ((bVar27 & 3) != 0) {
          local_480 = "number with leading zero is not allowed";
          p_Var51 = p_Var40 + -1;
          local_4b0 = p_Var51;
          local_498 = val;
          goto LAB_01d1011c;
        }
        p_Var51 = p_Var40;
        if ((bVar27 & 0x20) != 0) {
          bVar20 = (digi_table[(byte)p_Var40[1]] & 0xc) == 0;
          p_Var51 = p_Var40 + (2 - (ulong)bVar20);
          if ((digi_table[(byte)p_Var40[2 - (ulong)bVar20]] & 3) == 0) {
            local_480 = "no digit after exponent sign";
            local_4b0 = p_Var51;
            local_498 = val;
            goto LAB_01d1011c;
          }
          do {
            pcVar1 = p_Var51 + 1;
            p_Var51 = p_Var51 + 1;
          } while ((digi_table[(byte)*pcVar1] & 3) != 0);
        }
        pyVar23[1].root = (yyjson_val *)0x14;
        pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar28 == 0x2d) << 0x3f);
        local_4b0 = p_Var51;
        local_498 = val;
      }
    }
    else {
      p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 - 0x30);
      cVar30 = p_Var51[1];
      uVar24 = (ulong)(byte)cVar30 - 0x30;
      if (uVar24 < 10) {
        p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar24 + (long)p_Var40 * 10);
        cVar30 = p_Var51[2];
        uVar48 = (ulong)(byte)cVar30 - 0x30;
        if (uVar48 < 10) {
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[3];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 3;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d11852;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[4];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 4;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d1186d;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[5];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 5;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d11888;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[6];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 6;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d118a3;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[7];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 7;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d118be;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[8];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 8;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d118d9;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[9];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 9;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d118f4;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[10];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 10;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d1190f;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0xb];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0xb;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d1192a;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0xc];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0xc;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d11945;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0xd];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0xd;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d11960;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0xe];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0xe;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d1197b;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0xf];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0xf;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d11996;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0x10];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0x10;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d119b1;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0x11];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0x11;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d119cc;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          cVar30 = p_Var51[0x12];
          uVar48 = (ulong)(byte)cVar30 - 0x30;
          if (9 < uVar48) {
            p_Var52 = p_Var51 + 0x12;
            if ((digi_table[(byte)cVar30] & 0x30) == 0) goto LAB_01d105a0;
            if (cVar30 == (code)0x2e) goto LAB_01d119e7;
            goto LAB_01d11d7b;
          }
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
          p_Var52 = p_Var51 + 0x13;
          cVar30 = p_Var51[0x13];
          bVar27 = digi_table[(byte)cVar30];
          if ((bVar27 & 0x33) == 0) {
            local_4b0 = p_Var52;
            if ((bVar28 == 0x2d) && ((_func_void_ptr_void_ptr_size_t *)0x8000000000000000 < p_Var40)
               ) {
              if (cVar47 < '\0') {
                if (*pre != (u8 *)0x0) {
                  **pre = '\0';
                }
                pyVar23[1].root = (yyjson_val *)(((long)p_Var52 - (long)cur) * 0x100 + 1);
                pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
                *pre = (u8 *)p_Var52;
              }
              else {
                auVar54._8_4_ = (int)((ulong)p_Var40 >> 0x20);
                auVar54._0_8_ = p_Var40;
                auVar54._12_4_ = 0x45300000;
                pyVar23[1].root = (yyjson_val *)0x14;
                pyVar23[1].alc.malloc =
                     (_func_void_ptr_void_ptr_size_t *)
                     -((auVar54._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)p_Var40) - 4503599627370496.0));
              }
            }
            else {
              p_Var51 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var40;
              if (bVar28 != 0x2d) {
                p_Var51 = p_Var40;
              }
              pyVar23[1].root = (yyjson_val *)((ulong)(bVar28 == 0x2d) * 8 + 4);
              pyVar23[1].alc.malloc = p_Var51;
            }
            goto LAB_01d10090;
          }
          if (((bVar27 & 3) != 0) && ((digi_table[(byte)p_Var51[0x14]] & 0x33) == 0)) {
            uVar48 = (ulong)(byte)cVar30 - 0x30;
            if ((p_Var40 < (_func_void_ptr_void_ptr_size_t *)0x1999999999999999) ||
               ((p_Var40 == (_func_void_ptr_void_ptr_size_t *)0x1999999999999999 && (uVar48 < 6))))
            {
              local_4b0 = p_Var51 + 0x14;
              p_Var51 = (_func_void_ptr_void_ptr_size_t *)(uVar48 + (long)p_Var40 * 10);
              if (bVar28 == 0x2d) {
                if (cVar47 < '\0') {
                  if (*pre != (u8 *)0x0) {
                    **pre = '\0';
                  }
                  pyVar23[1].root = (yyjson_val *)(((long)local_4b0 - (long)cur) * 0x100 + 1);
                  pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
                  *pre = (u8 *)local_4b0;
                }
                else {
                  auVar55._8_4_ = (int)((ulong)p_Var51 >> 0x20);
                  auVar55._0_8_ = p_Var51;
                  auVar55._12_4_ = 0x45300000;
                  pyVar23[1].root = (yyjson_val *)0x14;
                  pyVar23[1].alc.malloc =
                       (_func_void_ptr_void_ptr_size_t *)
                       -((auVar55._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)p_Var51) - 4503599627370496.0));
                }
              }
              else {
                pyVar23[1].root = (yyjson_val *)0x4;
                pyVar23[1].alc.malloc = p_Var51;
              }
              goto LAB_01d10090;
            }
          }
          p_Var49 = (_func_void_ptr_void_ptr_size_t *)0x0;
          if ((bVar27 & 0x20) != 0) {
            p_Var51 = (_func_void_ptr_void_ptr_size_t *)0x0;
            p_Var46 = (_func_void_ptr_void_ptr_size_t *)0x0;
            p_Var50 = p_Var52;
            goto LAB_01d0fce0;
          }
          if (cVar30 == (code)0x2e) {
            cVar30 = p_Var51[0x14];
            p_Var51 = p_Var51 + 0x14;
            p_Var46 = p_Var51;
            if ((digi_table[(byte)cVar30] & 3) == 0) {
              local_480 = "no digit after decimal point";
              local_4b0 = p_Var51;
              local_498 = val;
              goto LAB_01d1011c;
            }
          }
          else {
            p_Var46 = p_Var52;
            p_Var52 = (_func_void_ptr_void_ptr_size_t *)0x0;
          }
LAB_01d0fbba:
          pyVar44 = (yyjson_val *)((long)p_Var46 * 0x100 + (long)cur * -0x100 + 1);
          p_Var51 = p_Var46 + 1;
          do {
            p_Var49 = p_Var51;
            bVar27 = digi_table[(byte)*p_Var49];
            p_Var51 = p_Var49 + 1;
            pyVar44 = pyVar44 + 0x10;
          } while ((bVar27 & 3) != 0);
          p_Var50 = p_Var49;
          if (p_Var52 == (_func_void_ptr_void_ptr_size_t *)0x0) {
            if ((cVar47 < '\0') && ((bVar27 & 0x30) == 0)) {
              if (*pre != (u8 *)0x0) {
                **pre = '\0';
              }
              pyVar23[1].root = pyVar44;
              pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
              *pre = (u8 *)p_Var49;
              local_4b0 = p_Var49;
              local_498 = val;
              goto LAB_01d10090;
            }
            p_Var52 = p_Var49;
            if (*p_Var49 == (_func_void_ptr_void_ptr_size_t)0x2e) {
              if ((digi_table[(byte)*p_Var51] & 3) == 0) {
                local_480 = "no digit after decimal point";
                local_4b0 = p_Var51;
                local_498 = val;
                goto LAB_01d1011c;
              }
              do {
                p_Var50 = p_Var49 + 1;
                bVar27 = digi_table[(byte)p_Var49[1]];
                p_Var49 = p_Var50;
              } while ((bVar27 & 3) != 0);
            }
          }
          p_Var40 = p_Var40 + (0x34 < (byte)cVar30);
          p_Var41 = p_Var50;
          do {
            do {
              p_Var41 = p_Var41 + -1;
            } while (*p_Var41 == (_func_void_ptr_void_ptr_size_t)0x30);
          } while (*p_Var41 == (_func_void_ptr_void_ptr_size_t)0x2e);
          p_Var49 = p_Var52 + ((ulong)(p_Var52 < p_Var46) - (long)p_Var46);
          p_Var51 = p_Var50;
          if (p_Var41 < p_Var46) {
            p_Var46 = (_func_void_ptr_void_ptr_size_t *)0x0;
            p_Var51 = (_func_void_ptr_void_ptr_size_t *)0x0;
          }
          if ((bVar27 & 0x20) != 0) goto LAB_01d0fce0;
        }
        else {
          p_Var52 = p_Var51 + 2;
          if ((digi_table[(byte)cVar30] & 0x30) == 0) {
LAB_01d105a0:
            pyVar23[1].root = (yyjson_val *)((ulong)(bVar28 == 0x2d) * 8 + 4);
            p_Var51 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var40;
            if (bVar28 != 0x2d) {
              p_Var51 = p_Var40;
            }
            pyVar23[1].alc.malloc = p_Var51;
            local_4b0 = p_Var52;
            goto LAB_01d10090;
          }
          if (cVar30 == (code)0x2e) goto LAB_01d11837;
LAB_01d11d7b:
          p_Var51 = p_Var52;
          p_Var49 = (_func_void_ptr_void_ptr_size_t *)0x0;
          p_Var46 = (_func_void_ptr_void_ptr_size_t *)0x0;
          p_Var50 = p_Var51;
          p_Var52 = p_Var51;
LAB_01d0fce0:
          cVar30 = p_Var50[1];
          uVar48 = (ulong)((digi_table[(byte)cVar30] & 0xc) != 0);
          if ((digi_table[(byte)p_Var50[uVar48 + 1]] & 3) == 0) {
            p_Var51 = p_Var50 + uVar48 + 1;
            local_480 = "no digit after exponent sign";
            local_4b0 = p_Var51;
            local_498 = val;
            goto LAB_01d1011c;
          }
          p_Var41 = p_Var50 + uVar48;
          p_Var50 = p_Var41;
          do {
            uVar48 = (ulong)(byte)p_Var50[1];
            p_Var50 = p_Var50 + 1;
            p_Var41 = p_Var41 + 1;
          } while (uVar48 == 0x30);
          if ((digi_table[uVar48] & 3) == 0) {
            lVar45 = 0;
          }
          else {
            lVar45 = 0;
            do {
              lVar45 = (ulong)(byte)((char)uVar48 - 0x30) + lVar45 * 10;
              uVar48 = (ulong)(byte)p_Var50[1];
              p_Var50 = p_Var50 + 1;
            } while ((digi_table[uVar48] & 3) != 0);
          }
          if (0x12 < (long)p_Var50 - (long)p_Var41) {
            if (cVar30 == (code)0x2d) {
              pyVar23[1].root = (yyjson_val *)0x14;
              pyVar23[1].alc.malloc =
                   (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar28 == 0x2d) << 0x3f);
              local_4b0 = p_Var50;
              local_498 = val;
            }
            else if (cVar47 < '\0') {
              if (*pre != (u8 *)0x0) {
                **pre = '\0';
              }
              pyVar23[1].root = (yyjson_val *)(((long)p_Var50 - (long)cur) * 0x100 + 1);
              pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
              *pre = (u8 *)p_Var50;
              local_4b0 = p_Var50;
              local_498 = val;
            }
            else {
              if ((flg & 0x10) == 0) {
                local_480 = "number is infinity when parsed as double";
                p_Var51 = (_func_void_ptr_void_ptr_size_t *)cur;
                local_498 = val;
                goto LAB_01d1011c;
              }
              pyVar23[1].root = (yyjson_val *)0x14;
              pyVar23[1].alc.malloc =
                   (_func_void_ptr_void_ptr_size_t *)
                   (((ulong)(bVar28 != 0x2d) << 0x3f) + -0x10000000000000);
              local_4b0 = p_Var50;
              local_498 = val;
            }
            goto LAB_01d10090;
          }
          lVar53 = -lVar45;
          if (cVar30 != (code)0x2d) {
            lVar53 = lVar45;
          }
          p_Var49 = p_Var49 + lVar53;
        }
        if ((long)p_Var49 < -0x157) {
          pyVar23[1].root = (yyjson_val *)0x14;
          pyVar23[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar28 == 0x2d) << 0x3f);
          local_4b0 = p_Var50;
          local_498 = val;
        }
        else {
          if ((long)p_Var49 < 0x135) goto LAB_01d0fd84;
          if (cVar47 < '\0') {
            if (*pre != (u8 *)0x0) {
              **pre = '\0';
            }
            pyVar23[1].root = (yyjson_val *)(((long)p_Var50 - (long)cur) * 0x100 + 1);
            pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
            *pre = (u8 *)p_Var50;
            local_4b0 = p_Var50;
            local_498 = val;
          }
          else {
            if ((flg & 0x10) == 0) {
              local_480 = "number is infinity when parsed as double";
              p_Var51 = (_func_void_ptr_void_ptr_size_t *)cur;
              local_498 = val;
              goto LAB_01d1011c;
            }
            pyVar23[1].root = (yyjson_val *)0x14;
            pyVar23[1].alc.malloc =
                 (_func_void_ptr_void_ptr_size_t *)
                 (((ulong)(bVar28 != 0x2d) << 0x3f) + -0x10000000000000);
            local_4b0 = p_Var50;
            local_498 = val;
          }
        }
      }
      else {
        if ((digi_table[(byte)cVar30] & 0x30) == 0) {
          pyVar23[1].root = (yyjson_val *)((ulong)(bVar28 == 0x2d) * 8 + 4);
          if (bVar28 == 0x2d) {
            p_Var40 = (_func_void_ptr_void_ptr_size_t *)(0x30 - uVar48);
          }
          pyVar23[1].alc.malloc = p_Var40;
          local_4b0 = p_Var51 + 1;
          goto LAB_01d10090;
        }
        p_Var49 = p_Var51;
        p_Var52 = p_Var51 + 1;
        if (cVar30 != (code)0x2e) goto LAB_01d11d7b;
LAB_01d1181c:
        p_Var52 = p_Var51 + 1;
        cVar30 = p_Var49[2];
        if ((ulong)(byte)cVar30 - 0x30 < 10) {
          p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                    (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
          p_Var51 = p_Var49;
LAB_01d11837:
          cVar30 = p_Var51[3];
          if ((ulong)(byte)cVar30 - 0x30 < 10) {
            p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d11852:
            cVar30 = p_Var51[4];
            if ((ulong)(byte)cVar30 - 0x30 < 10) {
              p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                        (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d1186d:
              cVar30 = p_Var51[5];
              if ((ulong)(byte)cVar30 - 0x30 < 10) {
                p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                          (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d11888:
                cVar30 = p_Var51[6];
                if ((ulong)(byte)cVar30 - 0x30 < 10) {
                  p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                            (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d118a3:
                  cVar30 = p_Var51[7];
                  if ((ulong)(byte)cVar30 - 0x30 < 10) {
                    p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                              (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d118be:
                    cVar30 = p_Var51[8];
                    if ((ulong)(byte)cVar30 - 0x30 < 10) {
                      p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d118d9:
                      cVar30 = p_Var51[9];
                      if ((ulong)(byte)cVar30 - 0x30 < 10) {
                        p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                  (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d118f4:
                        cVar30 = p_Var51[10];
                        if ((ulong)(byte)cVar30 - 0x30 < 10) {
                          p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                    (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d1190f:
                          cVar30 = p_Var51[0xb];
                          if ((ulong)(byte)cVar30 - 0x30 < 10) {
                            p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                      (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d1192a:
                            cVar30 = p_Var51[0xc];
                            if ((ulong)(byte)cVar30 - 0x30 < 10) {
                              p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                        (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d11945:
                              cVar30 = p_Var51[0xd];
                              if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                          (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d11960:
                                cVar30 = p_Var51[0xe];
                                if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                  p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                            (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d1197b:
                                  cVar30 = p_Var51[0xf];
                                  if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                    p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                              (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d11996:
                                    cVar30 = p_Var51[0x10];
                                    if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                      p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                                (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10);
LAB_01d119b1:
                                      cVar30 = p_Var51[0x11];
                                      if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                        p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                                  (((ulong)(byte)cVar30 - 0x30) + (long)p_Var40 * 10
                                                  );
LAB_01d119cc:
                                        cVar30 = p_Var51[0x12];
                                        if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                          p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                                    (((ulong)(byte)cVar30 - 0x30) +
                                                    (long)p_Var40 * 10);
LAB_01d119e7:
                                          cVar30 = p_Var51[0x13];
                                          if ((ulong)(byte)cVar30 - 0x30 < 10) {
                                            p_Var40 = (_func_void_ptr_void_ptr_size_t *)
                                                      (((ulong)(byte)cVar30 - 0x30) +
                                                      (long)p_Var40 * 10);
                                            cVar30 = p_Var51[0x14];
                                            p_Var51 = p_Var51 + 0x14;
                                            p_Var46 = p_Var51;
                                            if ((digi_table[(byte)cVar30] & 3) != 0)
                                            goto LAB_01d0fbba;
                                          }
                                          else {
                                            p_Var51 = p_Var51 + 0x13;
                                          }
                                        }
                                        else {
                                          p_Var51 = p_Var51 + 0x12;
                                        }
                                      }
                                      else {
                                        p_Var51 = p_Var51 + 0x11;
                                      }
                                    }
                                    else {
                                      p_Var51 = p_Var51 + 0x10;
                                    }
                                  }
                                  else {
                                    p_Var51 = p_Var51 + 0xf;
                                  }
                                }
                                else {
                                  p_Var51 = p_Var51 + 0xe;
                                }
                              }
                              else {
                                p_Var51 = p_Var51 + 0xd;
                              }
                            }
                            else {
                              p_Var51 = p_Var51 + 0xc;
                            }
                          }
                          else {
                            p_Var51 = p_Var51 + 0xb;
                          }
                        }
                        else {
                          p_Var51 = p_Var51 + 10;
                        }
                      }
                      else {
                        p_Var51 = p_Var51 + 9;
                      }
                    }
                    else {
                      p_Var51 = p_Var51 + 8;
                    }
                  }
                  else {
                    p_Var51 = p_Var51 + 7;
                  }
                }
                else {
                  p_Var51 = p_Var51 + 6;
                }
              }
              else {
                p_Var51 = p_Var51 + 5;
              }
            }
            else {
              p_Var51 = p_Var51 + 4;
            }
          }
          else {
            p_Var51 = p_Var51 + 3;
          }
        }
        else {
          p_Var51 = p_Var49 + 2;
        }
        if (p_Var52 + 1 == p_Var51) {
          local_480 = "no digit after decimal point";
          local_4b0 = p_Var51;
          local_498 = val;
          goto LAB_01d1011c;
        }
        p_Var49 = p_Var52 + (1 - (long)p_Var51);
        p_Var50 = p_Var51;
        if ((digi_table[(byte)cVar30] & 0x20) != 0) {
          p_Var46 = (_func_void_ptr_void_ptr_size_t *)0x0;
          goto LAB_01d0fce0;
        }
        if ((long)p_Var49 < -0x157) {
          pyVar23[1].root = (yyjson_val *)0x14;
          pyVar23[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar28 == 0x2d) << 0x3f);
          local_4b0 = p_Var51;
          local_498 = val;
          goto LAB_01d10090;
        }
        p_Var46 = (_func_void_ptr_void_ptr_size_t *)0x0;
LAB_01d0fd84:
        local_45c = (uint)p_Var49;
        if (((ulong)p_Var40 >> 0x35 == 0) && (local_45c + 0x16 < 0x2d)) {
          if ((int)local_45c < 0) {
            p_Var51 = (_func_void_ptr_void_ptr_size_t *)
                      ((double)(long)p_Var40 / *(double *)(f64_pow10_table + (ulong)-local_45c * 8))
            ;
          }
          else {
            p_Var51 = (_func_void_ptr_void_ptr_size_t *)
                      ((double)(long)p_Var40 *
                      *(double *)(f64_pow10_table + (ulong)(local_45c & 0x7fffffff) * 8));
          }
          pyVar23[1].root = (yyjson_val *)0x14;
          if (bVar28 == 0x2d) {
            p_Var51 = (_func_void_ptr_void_ptr_size_t *)((ulong)p_Var51 ^ 0x8000000000000000);
          }
          pyVar23[1].alc.malloc = p_Var51;
          local_4b0 = p_Var50;
          local_498 = val;
        }
        else {
          local_478 = hdr;
          local_450 = p_Var52;
          if ((local_45c + 0x132 < 0x252) && (p_Var46 == (_func_void_ptr_void_ptr_size_t *)0x0)) {
            lVar53 = (long)(int)(local_45c * 2 + 0x2ae);
            uVar48 = 0x3f;
            if (p_Var40 != (_func_void_ptr_void_ptr_size_t *)0x0) {
              for (; (ulong)p_Var40 >> uVar48 == 0; uVar48 = uVar48 - 1) {
              }
            }
            iVar39 = (int)(uVar48 ^ 0x3f);
            uVar48 = (long)p_Var40 << ((byte)(uVar48 ^ 0x3f) & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar48;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(pow10_sig_table + lVar53 * 8);
            auVar3 = auVar3 * auVar8;
            lVar31 = auVar3._8_8_;
            uVar24 = auVar3._0_8_;
            iVar34 = (int)(local_45c * 0x3526a + -0x3f0000) >> 0x10;
            if (0x1fd < (ulong)(auVar3._8_4_ & 0x1ff) - 1) {
              lVar45 = (long)(int)(local_45c * 2 + 0x2af);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar48;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(pow10_sig_table + lVar45 * 8);
              lVar32 = SUB168(auVar4 * auVar9,8);
              if (0xfffffffffffffffd < (lVar32 + uVar24) - 1) goto LAB_01d0ff2d;
              lVar31 = lVar31 + (ulong)(lVar32 + uVar24 < uVar24);
            }
            uVar48 = lVar31 << (-1 < lVar31);
            uVar48 = (uVar48 & 0x400) + uVar48;
            uVar48 = uVar48 >> 0xb & 0xfffffffffffff |
                     (ulong)(((iVar34 - iVar39) - (uint)(-1 < lVar31)) + 0x47e +
                            (uint)(uVar48 < 0x400)) << 0x34;
            pyVar23[1].root = (yyjson_val *)0x14;
            uVar25 = (ulong)(bVar28 == 0x2d) << 0x3f;
            local_498 = val;
            local_48c = flg;
LAB_01d0fecd:
            pyVar23[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)(uVar25 | uVar48);
            hdr = local_478;
            pre = local_4a8;
            val = local_498;
            flg = local_48c;
            local_4b0 = p_Var50;
          }
          else {
            uVar48 = 0x3f;
            if (p_Var40 != (_func_void_ptr_void_ptr_size_t *)0x0) {
              for (; (ulong)p_Var40 >> uVar48 == 0; uVar48 = uVar48 - 1) {
              }
            }
            iVar39 = (int)(uVar48 ^ 0x3f);
            uVar48 = (long)p_Var40 << ((byte)(uVar48 ^ 0x3f) & 0x3f);
            lVar53 = (long)(int)(local_45c * 2 + 0x2ae);
            lVar45 = (long)(int)(local_45c * 2 + 0x2af);
            iVar34 = (int)(local_45c * 0x3526a + -0x3f0000) >> 0x10;
LAB_01d0ff2d:
            lVar31 = ((ulong)(p_Var46 != (_func_void_ptr_void_ptr_size_t *)0x0) << 2) <<
                     ((byte)iVar39 & 0x3f);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar48;
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 *(long *)(pow10_sig_table + lVar53 * 8) -
                 (*(long *)(pow10_sig_table + lVar45 * 8) >> 0x3f);
            uVar24 = SUB168(auVar5 * auVar10,8) - (SUB168(auVar5 * auVar10,0) >> 0x3f);
            uVar48 = 0x3f;
            if (uVar24 != 0) {
              for (; uVar24 >> uVar48 == 0; uVar48 = uVar48 - 1) {
              }
            }
            bVar27 = (byte)(uVar48 ^ 0x3f);
            uVar24 = uVar24 << (bVar27 & 0x3f);
            uVar25 = (9 - (ulong)(lVar31 == 0)) + lVar31 << (bVar27 & 0x3f);
            uVar35 = ((iVar34 - (int)(uVar48 ^ 0x3f)) - iVar39) + 0x40;
            iVar34 = 0xb;
            if (((int)uVar35 < -0x43d) &&
               ((iVar34 = 0x40, uVar35 < 0xfffffb8f ||
                (iVar34 = -0x432 - uVar35, uVar35 < 0xfffffb92)))) {
              bVar27 = (char)iVar34 - 0x3c;
              uVar24 = uVar24 >> (bVar27 & 0x3f);
              uVar35 = (uVar35 + iVar34) - 0x3c;
              uVar25 = (uVar25 >> (bVar27 & 0x3f)) + 9;
              iVar34 = 0x3c;
            }
            bVar27 = (byte)iVar34;
            uVar42 = (~(-1L << (bVar27 & 0x3f)) & uVar24) * 8;
            lVar45 = 8L << (bVar27 - 1 & 0x3f);
            uVar48 = lVar45 + uVar25;
            uVar24 = (ulong)(uVar48 <= uVar42) + (uVar24 >> (bVar27 & 0x3f));
            if (uVar24 == 0) {
              uVar24 = 0;
LAB_01d1003c:
              if ((uVar42 <= lVar45 - uVar25) || (uVar48 <= uVar42)) {
                pyVar23[1].root = (yyjson_val *)0x14;
                pyVar23[1].alc.malloc =
                     (_func_void_ptr_void_ptr_size_t *)(uVar24 | (ulong)(bVar28 == 0x2d) << 0x3f);
                local_4b0 = p_Var50;
                local_498 = val;
                local_48c = flg;
                goto LAB_01d10090;
              }
              local_470 = 0xfffffbcd;
              if (0xfffffffffffff < uVar24) {
                local_470 = (ulong)((uint)(uVar24 >> 0x34) - 0x434);
              }
              uVar48 = (uVar24 & 0xfffffffffffff) + 0x10000000000000;
              if (0xfffffffffffff >= uVar24) {
                uVar48 = uVar24;
              }
              local_458 = &local_440;
              local_498 = val;
              local_48c = flg;
              bigint_set_buf(local_458,(u64)p_Var40,(i32 *)&local_45c,(u8 *)p_Var46,(u8 *)p_Var51,
                             (u8 *)p_Var52);
              local_238.bits[0] = uVar48 * 2 + 1;
              if ((int)local_45c < 0) {
                if (local_45c < 0xffffffee) {
                  uVar37 = 1;
                  uVar35 = -local_45c;
                  do {
                    uVar25 = (ulong)uVar37;
                    uVar48 = 0;
                    if (uVar37 == 0) {
LAB_01d10bb9:
                      if ((uint)uVar48 < uVar37) {
                        uVar48 = uVar48 & 0xffffffff;
                        uVar42 = 0;
                        do {
                          auVar16._8_8_ = 0;
                          auVar16._0_8_ = uVar42;
                          auVar12._8_8_ = 0;
                          auVar12._0_8_ = local_238.bits[uVar48];
                          auVar16 = ZEXT816(10000000000000000000) * auVar12 + auVar16;
                          uVar42 = auVar16._8_8_;
                          local_238.bits[uVar48] = auVar16._0_8_;
                          uVar48 = uVar48 + 1;
                        } while (uVar25 != uVar48);
                        if (uVar42 != 0) {
                          uVar37 = uVar37 + 1;
                          local_238.bits[uVar25] = uVar42;
                        }
                      }
                    }
                    else {
                      uVar48 = 0;
                      do {
                        if (local_238.bits[uVar48] != 0) goto LAB_01d10bb9;
                        uVar48 = uVar48 + 1;
                      } while (uVar25 != uVar48);
                    }
                    uVar22 = uVar35 - 0x13;
                    bVar20 = 0x25 < (int)uVar35;
                    uVar35 = uVar22;
                  } while (bVar20);
                  if (uVar22 != 0) {
                    uVar48 = *(ulong *)(u64_pow10_table + (long)(int)uVar22 * 8);
                    if (uVar37 != 0) goto LAB_01d10d3c;
                    uVar37 = 0;
                    uVar25 = 0;
LAB_01d10c27:
                    if ((uint)uVar25 < uVar37) {
                      uVar25 = uVar25 & 0xffffffff;
                      uVar43 = 0;
                      do {
                        auVar17._8_8_ = 0;
                        auVar17._0_8_ = uVar43;
                        auVar6._8_8_ = 0;
                        auVar6._0_8_ = uVar48;
                        auVar13._8_8_ = 0;
                        auVar13._0_8_ = local_238.bits[uVar25];
                        auVar17 = auVar6 * auVar13 + auVar17;
                        uVar43 = auVar17._8_8_;
                        local_238.bits[uVar25] = auVar17._0_8_;
                        uVar25 = uVar25 + 1;
                      } while (uVar37 != uVar25);
                      if (uVar43 != 0) {
                        uVar42 = (ulong)(uVar37 + 1);
                        local_458 = &local_238;
                        goto LAB_01d10da0;
                      }
                    }
                  }
                  uVar42 = (ulong)uVar37;
                }
                else {
                  local_238.used = 1;
                  uVar48 = *(ulong *)(u64_pow10_table + (ulong)-local_45c * 8);
                  uVar37 = 1;
LAB_01d10d3c:
                  uVar42 = (ulong)uVar37;
                  uVar25 = 0;
                  do {
                    if (local_238.bits[uVar25] != 0) goto LAB_01d10c27;
                    uVar25 = uVar25 + 1;
                  } while (uVar42 != uVar25);
                }
              }
              else {
                uVar22 = local_45c;
                uVar37 = local_440.used;
                uVar35 = local_45c;
                if (0x12 < local_45c) {
                  do {
                    uVar25 = (ulong)local_440.used;
                    uVar48 = 0;
                    uVar37 = local_440.used;
                    if (local_440.used == 0) {
LAB_01d109f5:
                      if ((uint)uVar48 < local_440.used) {
                        uVar48 = uVar48 & 0xffffffff;
                        uVar42 = 0;
                        do {
                          auVar15._8_8_ = 0;
                          auVar15._0_8_ = uVar42;
                          auVar11._8_8_ = 0;
                          auVar11._0_8_ = local_440.bits[uVar48];
                          auVar15 = ZEXT816(10000000000000000000) * auVar11 + auVar15;
                          uVar42 = auVar15._8_8_;
                          local_440.bits[uVar48] = auVar15._0_8_;
                          uVar48 = uVar48 + 1;
                        } while (uVar25 != uVar48);
                        if (uVar42 != 0) {
                          local_440.bits[uVar25] = uVar42;
                          uVar37 = local_440.used + 1;
                        }
                      }
                    }
                    else {
                      uVar48 = 0;
                      do {
                        if (local_440.bits[uVar48] != 0) goto LAB_01d109f5;
                        uVar48 = uVar48 + 1;
                      } while (uVar25 != uVar48);
                    }
                    uVar35 = uVar22 - 0x13;
                    bVar20 = 0x25 < (int)uVar22;
                    uVar22 = uVar35;
                    local_440.used = uVar37;
                  } while (bVar20);
                }
                local_440.used = uVar37;
                uVar42 = 1;
                if (uVar35 != 0) {
                  uVar48 = *(ulong *)(u64_pow10_table + (long)(int)uVar35 * 8);
                  if (uVar37 == 0) {
                    uVar25 = 0;
LAB_01d10d5b:
                    if ((uint)uVar25 < uVar37) {
                      uVar25 = uVar25 & 0xffffffff;
                      uVar43 = 0;
                      do {
                        auVar18._8_8_ = 0;
                        auVar18._0_8_ = uVar43;
                        auVar7._8_8_ = 0;
                        auVar7._0_8_ = uVar48;
                        auVar14._8_8_ = 0;
                        auVar14._0_8_ = local_440.bits[uVar25];
                        auVar18 = auVar7 * auVar14 + auVar18;
                        uVar43 = auVar18._8_8_;
                        local_440.bits[uVar25] = auVar18._0_8_;
                        uVar25 = uVar25 + 1;
                      } while (uVar37 != uVar25);
                      if (uVar43 != 0) {
                        local_440.used = uVar37 + 1;
                        uVar42 = 1;
LAB_01d10da0:
                        local_458->bits[uVar37] = uVar43;
                      }
                    }
                  }
                  else {
                    uVar25 = 0;
                    do {
                      if (local_440.bits[uVar25] != 0) goto LAB_01d10d5b;
                      uVar25 = uVar25 + 1;
                    } while (uVar37 != uVar25);
                  }
                }
              }
              uVar35 = (uint)uVar42;
              if ((int)(uint)local_470 < 1) {
                uVar22 = -(uint)local_470;
                uVar38 = uVar22 >> 6;
                uVar48 = (ulong)local_440.used;
                if ((uVar22 & 0x3f) == 0) {
                  if (uVar48 != 0) {
                    do {
                      local_440.bits[((uVar22 >> 6) - 1) + (int)uVar48] = local_440.bits[uVar48 - 1]
                      ;
                      uVar48 = uVar48 - 1;
                    } while (uVar48 != 0);
                  }
                  local_440.used = local_440.used + uVar38;
                }
                else {
                  local_440.bits[uVar48] = 0;
                  sVar29 = (sbyte)(uVar22 & 0x3f);
                  if (uVar48 != 0) {
                    do {
                      local_440.bits[(uVar22 >> 6) + (int)uVar48] =
                           local_440.bits[uVar48 - 1] >> (0x40U - sVar29 & 0x3f) |
                           local_440.bits[uVar48] << sVar29;
                      uVar48 = uVar48 - 1;
                    } while (uVar48 != 0);
                  }
                  local_440.bits[uVar38] = local_440.bits[0] << sVar29;
                  local_440.used =
                       (local_440.used + uVar38 + 1) -
                       (uint)(local_440.bits[local_440.used + uVar38] == 0);
                }
                if (0x3f < uVar22) {
                  __s = local_440.bits;
                  goto LAB_01d10f09;
                }
              }
              else {
                __s = local_238.bits;
                uVar48 = local_470 >> 6 & 0x3ffffff;
                bVar28 = (byte)local_470 & 0x3f;
                uVar38 = (uint)uVar48;
                if ((local_470 & 0x3f) == 0) {
                  if (uVar35 != 0) {
                    do {
                      local_238.bits[(((uint)(local_470 >> 6) & 0x3ffffff) - 1) + (int)uVar42] =
                           local_238.bits[uVar42 - 1];
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar35 = uVar35 + uVar38;
                  local_238.used = uVar35;
                }
                else {
                  local_238.bits[uVar42] = 0;
                  if (uVar35 != 0) {
                    do {
                      local_238.bits[((uint)(local_470 >> 6) & 0x3ffffff) + (int)uVar42] =
                           local_238.bits[uVar42 - 1] >> (0x40 - bVar28 & 0x3f) |
                           local_238.bits[uVar42] << bVar28;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  local_238.bits[uVar48] = local_238.bits[0] << bVar28;
                  uVar35 = (uVar35 + uVar38 + 1) - (uint)(local_238.bits[uVar35 + uVar38] == 0);
                  if ((uint)local_470 < 0x40) goto LAB_01d10f1a;
                }
LAB_01d10f09:
                switchD_010444a0::default(__s,0,(ulong)(uVar38 - 1) * 8 + 8);
              }
LAB_01d10f1a:
              uVar48 = (ulong)local_440.used;
              if (local_440.used < uVar35) {
LAB_01d10f25:
                uVar25 = 0;
              }
              else {
                uVar25 = 1;
                if (local_440.used <= uVar35) {
                  do {
                    if (uVar48 == 0) {
                      uVar25 = (ulong)((uint)uVar24 & 1);
                      break;
                    }
                    lVar45 = uVar48 - 1;
                    lVar53 = uVar48 - 1;
                    if (local_440.bits[lVar53] < local_238.bits[lVar45]) goto LAB_01d10f25;
                    uVar48 = uVar48 - 1;
                  } while (local_440.bits[lVar53] <= local_238.bits[lVar45]);
                }
              }
              p_Var51 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
              uVar25 = uVar25 + uVar24;
              if (uVar25 != 0x7ff0000000000000) {
                pyVar23[1].root = (yyjson_val *)0x14;
                uVar48 = (ulong)((int)local_4a0 == 0x2d) << 0x3f;
                goto LAB_01d0fecd;
              }
              pcVar33 = local_4a0;
              if ((char)local_48c < '\0') goto LAB_01d11c4a;
              if ((local_48c & 0x10) == 0) goto LAB_01d1090a;
              pyVar23[1].root = (yyjson_val *)0x14;
              if ((int)local_4a0 == 0x2d) {
                p_Var51 = (_func_void_ptr_void_ptr_size_t *)0xfff0000000000000;
              }
            }
            else {
              uVar43 = 0x3f;
              if (uVar24 != 0) {
                for (; uVar24 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                }
              }
              uVar35 = (uVar35 + iVar34) - (int)(uVar43 ^ 0x3f);
              if ((int)uVar35 < 0x3c1) {
                uVar24 = (uVar24 << ((byte)(uVar43 ^ 0x3f) & 0x3f)) >> 0xb;
                if ((int)uVar35 < -0x43d) {
                  if (uVar35 < 0xfffffb8f) {
                    uVar24 = 0;
                  }
                  else {
                    uVar24 = uVar24 >> (-(char)uVar35 - 0x3dU & 0x3f);
                  }
                }
                else {
                  uVar24 = uVar24 & 0xfffffffffffff | (ulong)(uVar35 + 0x43e) << 0x34;
                  if (uVar24 == 0x7ff0000000000000) goto LAB_01d108f4;
                }
                goto LAB_01d1003c;
              }
LAB_01d108f4:
              local_498 = val;
              local_48c = flg;
              if (cVar47 < '\0') {
LAB_01d11c4a:
                local_4a0 = pcVar33;
                if (*local_4a8 != (u8 *)0x0) {
                  **local_4a8 = '\0';
                }
                pyVar23[1].root = (yyjson_val *)(((long)p_Var50 - (long)local_488) * 0x100 + 1);
                pyVar23[1].alc.malloc = local_488;
                *local_4a8 = (u8 *)p_Var50;
                hdr = local_478;
                pre = local_4a8;
                val = local_498;
                flg = local_48c;
                local_4b0 = p_Var50;
                goto LAB_01d10090;
              }
              if ((flg & 0x10) == 0) {
LAB_01d1090a:
                local_4a0 = pcVar33;
                local_480 = "number is infinity when parsed as double";
                local_4b0 = local_488;
                p_Var51 = local_488;
                hdr = local_478;
                flg = local_48c;
LAB_01d1011c:
                bVar20 = is_truncated_end(hdr,(u8 *)p_Var51,end,9,flg);
                if (bVar20) {
                  p_Var51 = (_func_void_ptr_void_ptr_size_t *)end;
                }
                pcVar33 = "unexpected end of data";
                if (!bVar20) {
                  pcVar33 = local_480;
                }
                local_468->pos = (long)p_Var51 - (long)hdr;
                local_468->code = (uint)!bVar20 * 4 + 5;
                local_468->msg = pcVar33;
                (*alc.free)(alc.ctx,pyVar23);
                return (yyjson_doc *)0x0;
              }
              pyVar23[1].root = (yyjson_val *)0x14;
              p_Var51 = (_func_void_ptr_void_ptr_size_t *)
                        (((ulong)(bVar28 != 0x2d) << 0x3f) + -0x10000000000000);
            }
            pyVar23[1].alc.malloc = p_Var51;
            hdr = local_478;
            pre = local_4a8;
            val = local_498;
            flg = local_48c;
            local_4b0 = p_Var50;
          }
        }
      }
    }
  }
  else {
    bVar20 = read_number_raw((u8 **)&local_4b0,pre,flg,(yyjson_val *)val,&local_480);
    p_Var51 = local_4b0;
    if (!bVar20) goto LAB_01d1011c;
  }
LAB_01d10090:
  if ((local_4b0 < end) && ((flg & 2) == 0)) {
    if ((flg & 8) == 0) {
      local_4b0 = local_4b0 + -1;
      do {
        pcVar1 = local_4b0 + 1;
        local_4b0 = local_4b0 + 1;
      } while ((char_table[(byte)*pcVar1] & 1) != 0);
    }
    else {
      local_4a8 = pre;
      bVar20 = skip_spaces_and_comments((u8 **)&local_4b0);
      p_Var51 = local_4b0;
      pre = local_4a8;
      if ((!bVar20) && (*(short *)local_4b0 == 0x2a2f)) {
        bVar20 = is_truncated_end(hdr,(u8 *)local_4b0,end,8,flg);
        if (bVar20) {
          p_Var51 = (_func_void_ptr_void_ptr_size_t *)end;
        }
        pcVar33 = "unclosed multiline comment";
        if (bVar20) {
          pcVar33 = "unexpected end of data";
        }
        local_468->pos = (long)p_Var51 - (long)hdr;
        local_468->code = (uint)!bVar20 * 3 + 5;
        local_468->msg = pcVar33;
        goto LAB_01d116f1;
      }
    }
    p_Var51 = local_4b0;
    if (local_4b0 < end) {
      bVar20 = is_truncated_end(hdr,(u8 *)local_4b0,end,4,flg);
      if (bVar20) {
        p_Var51 = (_func_void_ptr_void_ptr_size_t *)end;
      }
      pcVar33 = "unexpected content after document";
      if (bVar20) {
        pcVar33 = "unexpected end of data";
      }
      local_468->pos = (long)p_Var51 - (long)hdr;
      local_468->code = bVar20 + 4;
      local_468->msg = pcVar33;
LAB_01d116f1:
      (*alc.free)(alc.ctx,pyVar23);
      return (yyjson_doc *)0x0;
    }
  }
  if (((flg & 0xa0) != 0) && (*pre != (u8 *)0x0)) {
    **pre = '\0';
  }
  pyVar23->root = (yyjson_val *)val;
  (pyVar23->alc).malloc = alc.malloc;
  (pyVar23->alc).realloc = alc.realloc;
  (pyVar23->alc).free = alc.free;
  (pyVar23->alc).ctx = alc.ctx;
  pyVar23->dat_read = (long)local_4b0 - (long)hdr;
  pyVar23->val_read = 1;
  puVar26 = (u8 *)0x0;
  if ((flg & 1) == 0) {
    puVar26 = hdr;
  }
  pyVar23->str_pool = (char *)puVar26;
  return pyVar23;
code_r0x01d0f94e:
  uVar35 = *(uint *)p_Var49;
  while ((((uVar35 & 0xc0c0f0) == 0x8080e0 && ((uVar35 & 0x200f) != 0)) &&
         ((uVar35 & 0x200f) != 0x200d))) {
    pcVar1 = p_Var51 + 3;
    p_Var51 = p_Var51 + 3;
    uVar35 = *(uint *)pcVar1;
  }
  local_498 = val;
  local_48c = flg;
  if ((char)uVar35 < '\0') {
    if ((uVar35 & 0x1e) != 0 && (uVar35 & 0xc0e0) == 0x80c0) {
      do {
        uVar35 = *(uint *)(p_Var51 + 2);
        p_Var51 = p_Var51 + 2;
        if ((uVar35 & 0xc0e0) != 0x80c0) break;
      } while ((uVar35 & 0x1e) != 0);
    }
    if ((uVar35 & 0x3007) != 0 && (uVar35 & 0xc0c0c0f8) == 0x808080f0) {
      while (((byte)uVar35 >> 2 & (uVar35 & 0x3003) != 0) == 0) {
        uVar35 = *(uint *)(p_Var51 + 4);
        p_Var51 = p_Var51 + 4;
        if (((uVar35 & 0xc0c0c0f8) != 0x808080f0) || ((uVar35 & 0x3007) == 0)) break;
      }
    }
    if (p_Var49 != p_Var51) goto LAB_01d0f7b5;
    pcVar33 = local_4a0;
    if ((flg & 0x40) != 0) {
      p_Var51 = p_Var51 + 1;
      goto LAB_01d0f7b5;
    }
    goto LAB_01d115ca;
  }
  goto LAB_01d0f7b5;
}

Assistant:

static_noinline yyjson_doc *read_root_single(u8 *hdr,
                                             u8 *cur,
                                             u8 *end,
                                             yyjson_alc alc,
                                             yyjson_read_flag flg,
                                             yyjson_read_err *err) {

#define return_err(_pos, _code, _msg) do { \
    if (is_truncated_end(hdr, _pos, end, YYJSON_READ_ERROR_##_code, flg)) { \
        err->pos = (usize)(end - hdr); \
        err->code = YYJSON_READ_ERROR_UNEXPECTED_END; \
        err->msg = "unexpected end of data"; \
    } else { \
        err->pos = (usize)(_pos - hdr); \
        err->code = YYJSON_READ_ERROR_##_code; \
        err->msg = _msg; \
    } \
    if (val_hdr) alc.free(alc.ctx, (void *)val_hdr); \
    return NULL; \
} while (false)

    usize hdr_len; /* value count used by doc */
    usize alc_num; /* value count capacity */
    yyjson_val *val_hdr; /* the head of allocated values */
    yyjson_val *val; /* current value */
    yyjson_doc *doc; /* the JSON document, equals to val_hdr */
    const char *msg; /* error message */

    bool raw; /* read number as raw */
    bool inv; /* allow invalid unicode */
    u8 *raw_end; /* raw end for null-terminator */
    u8 **pre; /* previous raw end pointer */

    hdr_len = sizeof(yyjson_doc) / sizeof(yyjson_val);
    hdr_len += (sizeof(yyjson_doc) % sizeof(yyjson_val)) > 0;
    alc_num = hdr_len + 1; /* single value */

    val_hdr = (yyjson_val *)alc.malloc(alc.ctx, alc_num * sizeof(yyjson_val));
    if (unlikely(!val_hdr)) goto fail_alloc;
    val = val_hdr + hdr_len;
    raw = has_read_flag(NUMBER_AS_RAW) || has_read_flag(BIGNUM_AS_RAW);
    inv = has_read_flag(ALLOW_INVALID_UNICODE) != 0;
    raw_end = NULL;
    pre = raw ? &raw_end : NULL;

    if (char_is_number(*cur)) {
        if (likely(read_number(&cur, pre, flg, val, &msg))) goto doc_end;
        goto fail_number;
    }
    if (*cur == '"') {
        if (likely(read_string(&cur, end, inv, val, &msg))) goto doc_end;
        goto fail_string;
    }
    if (*cur == 't') {
        if (likely(read_true(&cur, val))) goto doc_end;
        goto fail_literal;
    }
    if (*cur == 'f') {
        if (likely(read_false(&cur, val))) goto doc_end;
        goto fail_literal;
    }
    if (*cur == 'n') {
        if (likely(read_null(&cur, val))) goto doc_end;
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (read_nan(false, &cur, pre, val)) goto doc_end;
        }
        goto fail_literal;
    }
    if (has_read_flag(ALLOW_INF_AND_NAN)) {
        if (read_inf_or_nan(false, &cur, pre, val)) goto doc_end;
    }
    goto fail_character;

doc_end:
    /* check invalid contents after json document */
    if (unlikely(cur < end) && !has_read_flag(STOP_WHEN_DONE)) {
        if (has_read_flag(ALLOW_COMMENTS)) {
            if (!skip_spaces_and_comments(&cur)) {
                if (byte_match_2(cur, "/*")) goto fail_comment;
            }
        } else {
            while (char_is_space(*cur)) cur++;
        }
        if (unlikely(cur < end)) goto fail_garbage;
    }

    if (pre && *pre) **pre = '\0';
    doc = (yyjson_doc *)val_hdr;
    doc->root = val_hdr + hdr_len;
    doc->alc = alc;
    doc->dat_read = (usize)(cur - hdr);
    doc->val_read = 1;
    doc->str_pool = has_read_flag(INSITU) ? NULL : (char *)hdr;
    return doc;

fail_string:
    return_err(cur, INVALID_STRING, msg);
fail_number:
    return_err(cur, INVALID_NUMBER, msg);
fail_alloc:
    return_err(cur, MEMORY_ALLOCATION, "memory allocation failed");
fail_literal:
    return_err(cur, LITERAL, "invalid literal");
fail_comment:
    return_err(cur, INVALID_COMMENT, "unclosed multiline comment");
fail_character:
    return_err(cur, UNEXPECTED_CHARACTER, "unexpected character");
fail_garbage:
    return_err(cur, UNEXPECTED_CONTENT, "unexpected content after document");

#undef return_err
}